

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBillboardSceneNode.cpp
# Opt level: O3

void __thiscall
irr::scene::CBillboardSceneNode::updateMesh(CBillboardSceneNode *this,ICameraSceneNode *camera)

{
  SMeshBuffer *pSVar1;
  pointer pSVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float in_XMM1_Da;
  float fVar5;
  float fVar6;
  float fVar7;
  vector3d<float> local_a0;
  vector3d<float> local_90;
  float local_80;
  float local_7c;
  vector3d<float> local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_28 = (**(code **)(*(long *)((long)&this->_vptr_CBillboardSceneNode +
                                   (long)this->_vptr_CBillboardSceneNode[-3]) + 0xe8))
                       ((_func_int *)
                        ((long)&this->_vptr_CBillboardSceneNode +
                        (long)this->_vptr_CBillboardSceneNode[-3]));
  local_7c = in_XMM1_Da;
  (*(camera->super_ISceneNode)._vptr_ISceneNode[0x1d])(camera);
  local_68._0_4_ = in_XMM1_Da;
  local_48 = extraout_XMM0_Da;
  fStack_44 = extraout_XMM0_Db;
  iVar3 = (*(camera->super_ISceneNode)._vptr_ISceneNode[0x2b])(camera);
  local_80 = *(float *)((undefined8 *)CONCAT44(extraout_var,iVar3) + 1);
  local_38 = *(undefined8 *)CONCAT44(extraout_var,iVar3);
  uStack_30 = 0;
  iVar3 = (*(camera->super_ISceneNode)._vptr_ISceneNode[0x2d])(camera);
  local_58 = ZEXT416(*(uint *)CONCAT44(extraout_var_00,iVar3));
  local_90.X = (float)local_38 - local_48;
  local_90.Y = local_38._4_4_ - fStack_44;
  local_90.Z = local_80 - (float)local_68._0_4_;
  local_68._8_8_ = 0;
  local_68._0_8_ = *(ulong *)((uint *)CONCAT44(extraout_var_00,iVar3) + 1);
  core::vector3d<float>::normalize(&local_90);
  fVar5 = local_90.Z * (float)local_68._0_4_ - (float)local_68._4_4_ * local_90.Y;
  fVar6 = local_90.X * (float)local_68._4_4_ - (float)local_58._0_4_ * local_90.Z;
  local_a0.Z = local_90.Y * (float)local_58._0_4_ - local_90.X * (float)local_68._0_4_;
  local_a0._0_8_ = CONCAT44(fVar6,fVar5);
  fVar5 = SQRT(local_a0.Z * local_a0.Z + fVar5 * fVar5 + fVar6 * fVar6);
  if ((fVar5 == 0.0) && (!NAN(fVar5))) {
    local_a0.Y = (float)local_58._0_4_;
    local_a0.X = (float)local_68._0_4_;
    local_a0.Z = (float)local_68._4_4_;
  }
  core::vector3d<float>::normalize(&local_a0);
  fVar6 = local_a0.Y;
  local_68 = ZEXT416((uint)this->TopEdgeWidth);
  fVar5 = (this->Size).Width * 0.5;
  local_48 = local_a0.Z;
  local_a0.Z = local_a0.Z * fVar5;
  local_58._8_8_ = 0;
  local_58._0_4_ = local_a0.X;
  local_58._4_4_ = local_a0.Y;
  local_a0.X = fVar5 * local_a0.X;
  local_a0.Y = fVar5 * fVar6;
  local_78.X = local_90.Z * local_a0.Y - local_a0.Z * local_90.Y;
  local_78.Y = local_90.X * local_a0.Z - local_a0.X * local_90.Z;
  local_78.Z = local_a0.X * local_90.Y - local_a0.Y * local_90.X;
  core::vector3d<float>::normalize(&local_78);
  fVar5 = (this->Size).Height * 0.5;
  local_78.X = fVar5 * local_78.X;
  local_78.Y = fVar5 * local_78.Y;
  local_78.Z = fVar5 * local_78.Z;
  local_90.Z = -local_90.Z;
  pSVar1 = this->Buffer;
  lVar4 = 0xc;
  do {
    pSVar2 = (pSVar1->Vertices).m_data.
             super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(float *)((long)&(pSVar2->Pos).Z + lVar4) = local_90.Z;
    *(ulong *)((long)&(pSVar2->Pos).X + lVar4) =
         CONCAT44(local_90.Y,local_90.X) ^ 0x8000000080000000;
    lVar4 = lVar4 + 0x24;
  } while (lVar4 != 0x9c);
  fVar7 = local_48 * 0.5 * (float)local_68._0_4_;
  pSVar2 = (pSVar1->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  (pSVar2->Pos).X = local_78.X + local_a0.X + (float)local_28;
  (pSVar2->Pos).Y = local_78.Y + local_a0.Y + local_28._4_4_;
  (pSVar2->Pos).Z = local_a0.Z + local_7c + local_78.Z;
  fVar5 = (float)local_68._0_4_ * (float)local_58._0_4_ * 0.5;
  fVar6 = (float)local_68._0_4_ * (float)local_58._4_4_ * 0.5;
  pSVar2 = (pSVar1->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2[1].Pos.X = ((float)local_28 + fVar5) - local_78.X;
  pSVar2[1].Pos.Y = (local_28._4_4_ + fVar6) - local_78.Y;
  pSVar2[1].Pos.Z = (local_7c + fVar7) - local_78.Z;
  pSVar2 = (pSVar1->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2[2].Pos.X = ((float)local_28 - fVar5) - local_78.X;
  pSVar2[2].Pos.Y = (local_28._4_4_ - fVar6) - local_78.Y;
  pSVar2[2].Pos.Z = (local_7c - fVar7) - local_78.Z;
  pSVar2 = (pSVar1->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2[3].Pos.X = ((float)local_28 - local_a0.X) + local_78.X;
  pSVar2[3].Pos.Y = (local_28._4_4_ - local_a0.Y) + local_78.Y;
  pSVar2[3].Pos.Z = (local_7c - local_a0.Z) + local_78.Z;
  local_90.X = -local_90.X;
  local_90.Y = -local_90.Y;
  (*(this->Buffer->super_IMeshBuffer)._vptr_IMeshBuffer[0x17])(this->Buffer,1);
  (*(this->Buffer->super_IMeshBuffer)._vptr_IMeshBuffer[0xc])();
  return;
}

Assistant:

void CBillboardSceneNode::updateMesh(const irr::scene::ICameraSceneNode *camera)
{
	// billboard looks toward camera
	core::vector3df pos = getAbsolutePosition();

	core::vector3df campos = camera->getAbsolutePosition();
	core::vector3df target = camera->getTarget();
	core::vector3df up = camera->getUpVector();
	core::vector3df view = target - campos;
	view.normalize();

	core::vector3df horizontal = up.crossProduct(view);
	if (horizontal.getLength() == 0) {
		horizontal.set(up.Y, up.X, up.Z);
	}
	horizontal.normalize();
	core::vector3df topHorizontal = horizontal * 0.5f * TopEdgeWidth;
	horizontal *= 0.5f * Size.Width;

	// pointing down!
	core::vector3df vertical = horizontal.crossProduct(view);
	vertical.normalize();
	vertical *= 0.5f * Size.Height;

	view *= -1.0f;

	core::array<video::S3DVertex> &vertices = Buffer->Vertices;

	for (s32 i = 0; i < 4; ++i)
		vertices[i].Normal = view;

	/* Vertices are:
	2--1
	|\ |
	| \|
	3--0
	*/
	vertices[0].Pos = pos + horizontal + vertical;
	vertices[1].Pos = pos + topHorizontal - vertical;
	vertices[2].Pos = pos - topHorizontal - vertical;
	vertices[3].Pos = pos - horizontal + vertical;

	Buffer->setDirty(EBT_VERTEX);
	Buffer->recalculateBoundingBox();
}